

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O1

void __thiscall
t_delphi_generator::generate_delphi_property_reader_impl
          (t_delphi_generator *this,ostream *out,string *cls_prefix,string *name,t_type *type,
          t_field *tfield,string *fieldPrefix,bool is_xception_class)

{
  t_type *ttype;
  int iVar1;
  ostream *poVar2;
  string local_70;
  string local_50;
  
  ttype = tfield->type_;
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"function ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(cls_prefix->_M_dataplus)._M_p,cls_prefix->_M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Get",3);
  prop_name_abi_cxx11_(&local_70,this,tfield,is_xception_class);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  type_name_abi_cxx11_(&local_50,this,ttype,false,true,SUB41(iVar1,0),true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"begin",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  this->indent_impl_ = this->indent_impl_ + 1;
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Result := ",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(fieldPrefix->_M_dataplus)._M_p,fieldPrefix->_M_string_length);
  prop_name_abi_cxx11_(&local_70,this,tfield,is_xception_class);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this->indent_impl_ = this->indent_impl_ + -1;
  poVar2 = indent_impl(this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"end;",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_delphi_generator::generate_delphi_property_reader_impl(ostream& out,
                                                              std::string cls_prefix,
                                                              std::string name,
                                                              t_type* type,
                                                              t_field* tfield,
                                                              std::string fieldPrefix,
                                                              bool is_xception_class) {
  (void)type;

  t_type* ftype = tfield->get_type();
  bool is_xception = ftype->is_xception();

  indent_impl(out) << "function " << cls_prefix << name << "."
                   << "Get" << prop_name(tfield, is_xception_class) << ": "
                   << type_name(ftype, false, true, is_xception, true) << ";" << endl;
  indent_impl(out) << "begin" << endl;
  indent_up_impl();
  indent_impl(out) << "Result := " << fieldPrefix << prop_name(tfield, is_xception_class) << ";"
                   << endl;
  indent_down_impl();
  indent_impl(out) << "end;" << endl << endl;
}